

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdiSubWindowPrivate::updateDirtyRegions(QMdiSubWindowPrivate *this)

{
  _Base_ptr p_Var1;
  iterator iVar2;
  iterator iVar3;
  long in_FS_OFFSET;
  _Base_ptr local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)&(this->super_QWidgetPrivate).field_0x10 != 0) {
    iVar2._M_node =
         (_Base_ptr)
         QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::begin
                   (&this->operationMap);
    iVar3 = QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::end
                      (&this->operationMap);
    for (; (iterator)iVar2._M_node != iVar3.i._M_node;
        iVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar2._M_node)) {
      getRegion((QMdiSubWindowPrivate *)&local_30,(Operation)this);
      p_Var1 = iVar2._M_node[1]._M_left;
      iVar2._M_node[1]._M_left = local_30;
      local_30 = p_Var1;
      QRegion::~QRegion((QRegion *)&local_30);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::updateDirtyRegions()
{
    // No update necessary
    if (!parent)
        return;

    for (OperationInfoMap::iterator it = operationMap.begin(), end = operationMap.end(); it != end; ++it)
        it.value().region = getRegion(it.key());
}